

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlSchemaParserCtxtPtrWrap(xmlSchemaParserCtxtPtr ctxt)

{
  PyObject *ret;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    ctxt_local = (xmlSchemaParserCtxtPtr)&_Py_NoneStruct;
  }
  else {
    ctxt_local = (xmlSchemaParserCtxtPtr)PyCapsule_New(ctxt,"xmlSchemaParserCtxtPtr",0);
  }
  return (PyObject *)ctxt_local;
}

Assistant:

PyObject *
libxml_xmlSchemaParserCtxtPtrWrap(xmlSchemaParserCtxtPtr ctxt)
{
	PyObject *ret;

	if (ctxt == NULL) {
		Py_INCREF(Py_None);
		return (Py_None);
	}
	ret = 
		PyCapsule_New((void *) ctxt,
									 (char *) "xmlSchemaParserCtxtPtr", NULL);

	return (ret);
}